

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# math.cpp
# Opt level: O0

Float pbrt::CatmullRom(span<const_float> nodes,span<const_float> values,Float x)

{
  float fVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  int iVar4;
  char (*args_4) [14];
  char (*args_3) [14];
  size_t sVar5;
  float *pfVar6;
  ulong uVar7;
  float in_XMM0_Da;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  Float t3;
  Float t2;
  Float t;
  Float d1;
  Float d0;
  Float width;
  Float f1;
  Float f0;
  Float x1;
  Float x0;
  int idx;
  size_t vb;
  size_t va;
  anon_class_16_2_b7c7ee50 *in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff60;
  float fVar12;
  undefined4 in_stack_ffffffffffffff64;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  float fVar13;
  int in_stack_ffffffffffffff94;
  float fVar14;
  undefined4 in_stack_ffffffffffffff98;
  float fVar15;
  undefined4 in_stack_ffffffffffffff9c;
  float fVar16;
  undefined8 in_stack_ffffffffffffffa0;
  LogLevel level;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  undefined4 in_stack_ffffffffffffffc8;
  span<const_float> local_30;
  span<const_float> local_20;
  
  level = (LogLevel)((ulong)in_stack_ffffffffffffffa0 >> 0x20);
  args_4 = (char (*) [14])pstd::span<const_float>::size(&local_20);
  args_3 = (char (*) [14])pstd::span<const_float>::size(&local_30);
  if (args_4 != args_3) {
    LogFatal<char_const(&)[13],char_const(&)[14],char_const(&)[13],unsigned_long&,char_const(&)[14],unsigned_long&>
              (level,(char *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
               in_stack_ffffffffffffff94,
               (char *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
               (char (*) [13])CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
               (char (*) [14])CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
               (char (*) [13])CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
               (unsigned_long *)args_3,args_4,
               (unsigned_long *)CONCAT44(in_XMM0_Da,in_stack_ffffffffffffffc8));
  }
  fVar16 = in_XMM0_Da;
  fVar8 = pstd::span<const_float>::front(&local_20);
  if ((fVar8 <= in_XMM0_Da) &&
     (fVar8 = fVar16, fVar9 = pstd::span<const_float>::back(&local_20), fVar16 <= fVar9)) {
    pstd::span<const_float>::size(&local_20);
    sVar5 = FindInterval<pbrt::CatmullRom(pstd::span<float_const>,pstd::span<float_const>,float)::__0>
                      (CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                       in_stack_ffffffffffffff58);
    iVar4 = (int)sVar5;
    pfVar6 = pstd::span<const_float>::operator[](&local_20,(long)iVar4);
    fVar16 = *pfVar6;
    pfVar6 = pstd::span<const_float>::operator[](&local_20,(long)(iVar4 + 1));
    fVar9 = *pfVar6;
    pfVar6 = pstd::span<const_float>::operator[](&local_30,(long)iVar4);
    fVar14 = *pfVar6;
    pfVar6 = pstd::span<const_float>::operator[](&local_30,(long)(iVar4 + 1));
    fVar1 = *pfVar6;
    fVar11 = fVar9 - fVar16;
    if (iVar4 < 1) {
      fVar10 = fVar1 - fVar14;
    }
    else {
      fVar12 = fVar1;
      fVar13 = fVar11;
      pfVar6 = pstd::span<const_float>::operator[](&local_30,(long)(iVar4 + -1));
      fVar10 = *pfVar6;
      fVar15 = fVar9;
      pfVar6 = pstd::span<const_float>::operator[](&local_20,(long)(iVar4 + -1));
      fVar10 = (fVar11 * (fVar12 - fVar10)) / (fVar9 - *pfVar6);
      fVar11 = fVar13;
      fVar9 = fVar15;
    }
    uVar7 = (ulong)(iVar4 + 2);
    sVar5 = pstd::span<const_float>::size(&local_20);
    if (uVar7 < sVar5) {
      pfVar6 = pstd::span<const_float>::operator[](&local_30,(long)(iVar4 + 2));
      fVar12 = *pfVar6 - fVar14;
      pfVar6 = pstd::span<const_float>::operator[](&local_20,(long)(iVar4 + 2));
      fVar11 = (fVar11 * fVar12) / (*pfVar6 - fVar16);
    }
    else {
      fVar11 = fVar1 - fVar14;
    }
    fVar9 = (fVar8 - fVar16) / (fVar9 - fVar16);
    fVar16 = fVar9 * fVar9;
    fVar8 = fVar16 * fVar9;
    auVar2 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40000000),0),ZEXT416((uint)fVar8),
                             ZEXT416((uint)-(fVar16 * 3.0)));
    auVar3 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),ZEXT416((uint)fVar8),
                             ZEXT416((uint)(fVar16 * 3.0)));
    auVar2 = vfmadd213ss_fma(ZEXT416((uint)fVar14),ZEXT416((uint)(auVar2._0_4_ + 1.0)),
                             ZEXT416((uint)(auVar3._0_4_ * fVar1)));
    auVar3 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),ZEXT416((uint)fVar16),
                             ZEXT416((uint)fVar8));
    auVar2 = vfmadd213ss_fma(ZEXT416((uint)fVar10),ZEXT416((uint)(auVar3._0_4_ + fVar9)),auVar2);
    auVar2 = vfmadd213ss_fma(ZEXT416((uint)fVar11),ZEXT416((uint)(fVar8 - fVar16)),auVar2);
    return auVar2._0_4_;
  }
  return 0.0;
}

Assistant:

Float CatmullRom(pstd::span<const Float> nodes, pstd::span<const Float> values, Float x) {
    CHECK_EQ(nodes.size(), values.size());
    if (!(x >= nodes.front() && x <= nodes.back()))
        return 0;
    int idx = FindInterval(nodes.size(), [&](int i) { return nodes[i] <= x; });
    Float x0 = nodes[idx], x1 = nodes[idx + 1];
    Float f0 = values[idx], f1 = values[idx + 1];
    Float width = x1 - x0;
    Float d0, d1;
    if (idx > 0)
        d0 = width * (f1 - values[idx - 1]) / (x1 - nodes[idx - 1]);
    else
        d0 = f1 - f0;

    if (idx + 2 < nodes.size())
        d1 = width * (values[idx + 2] - f0) / (nodes[idx + 2] - x0);
    else
        d1 = f1 - f0;

    Float t = (x - x0) / (x1 - x0), t2 = t * t, t3 = t2 * t;
    return (2 * t3 - 3 * t2 + 1) * f0 + (-2 * t3 + 3 * t2) * f1 + (t3 - 2 * t2 + t) * d0 +
           (t3 - t2) * d1;
}